

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mask.c
# Opt level: O2

int mask_or_r(uint32_t *dmask,uint32_t *smask,int size)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar1 = (long)(size + 0x1f) / 0x20;
  uVar4 = 0;
  uVar2 = uVar1 & 0xffffffff;
  if ((int)uVar1 < 1) {
    uVar2 = uVar4;
  }
  iVar3 = 0;
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    uVar5 = smask[uVar4] | dmask[uVar4];
    if (uVar5 != dmask[uVar4]) {
      iVar3 = 1;
    }
    dmask[uVar4] = uVar5;
  }
  return iVar3;
}

Assistant:

int mask_or_r(uint32_t *dmask, uint32_t *smask, int size) {
	int rsize = MASK_SIZE(size);
	int i;
	int res = 0;
	for (i = 0; i < rsize; i++) {
		uint32_t n = dmask[i] | smask[i];
		if (n != dmask[i])
			res = 1;
		dmask[i] = n;
	}
	return res;
}